

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O2

QString * __thiscall QString::replace(QString *this,qsizetype pos,qsizetype len,QChar after)

{
  long lVar1;
  long in_FS_OFFSET;
  QChar after_local;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  after_local = after;
  replace(this,pos,len,&after_local,1);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QString &QString::replace(qsizetype pos, qsizetype len, QChar after)
{
    return replace(pos, len, &after, 1);
}